

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_CreateTaprootAddress_Test::TestBody(AddressFactory_CreateTaprootAddress_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *message;
  AssertionResult gtest_ar_2;
  TaprootScriptTree tree;
  ScriptBuilder build;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SchnorrPubkey pubkey;
  Address addr;
  AddressFactory factory;
  Address *in_stack_fffffffffffff770;
  undefined5 in_stack_fffffffffffff778;
  undefined1 in_stack_fffffffffffff77d;
  undefined1 in_stack_fffffffffffff77e;
  undefined1 in_stack_fffffffffffff77f;
  char *in_stack_fffffffffffff780;
  undefined5 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78d;
  undefined1 in_stack_fffffffffffff78e;
  undefined1 in_stack_fffffffffffff78f;
  AssertHelper in_stack_fffffffffffff7a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7b0;
  AddressFactory *in_stack_fffffffffffff7b8;
  AssertionResult local_828;
  AssertHelper local_818;
  Message local_810;
  Address local_808;
  Script local_690;
  TaprootScriptTree local_658;
  ScriptBuilder local_5c8;
  AssertHelper local_5a8;
  Message local_5a0;
  string local_598;
  AssertionResult local_578;
  AssertHelper local_568;
  Message local_560;
  ByteData256 local_558;
  Address local_540;
  AssertHelper local_3c8;
  Message local_3c0;
  string local_3b8;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380 [2];
  Address local_370;
  allocator local_1f1;
  string local_1f0;
  SchnorrPubkey local_1d0;
  Address local_1a8;
  
  cfd::AddressFactory::AddressFactory((AddressFactory *)0x1cc39c);
  cfd::core::Address::Address(&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"
             ,&local_1f1);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateTaprootAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff77f,
                          CONCAT16(in_stack_fffffffffffff77e,
                                   CONCAT15(in_stack_fffffffffffff77d,in_stack_fffffffffffff778))),
                 (SchnorrPubkey *)in_stack_fffffffffffff770);
      cfd::core::Address::operator=(&local_1a8,&local_370);
      cfd::core::Address::~Address(in_stack_fffffffffffff770);
    }
  }
  else {
    testing::Message::Message(local_380);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13e,
               "Expected: addr = factory.CreateTaprootAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_388,local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message((Message *)0x1cc5c4);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_3b8,&local_1a8);
  testing::internal::EqHelper<false>::Compare<char[63],std::__cxx11::string>
            ((char *)CONCAT17(in_stack_fffffffffffff78f,
                              CONCAT16(in_stack_fffffffffffff78e,
                                       CONCAT15(in_stack_fffffffffffff78d,in_stack_fffffffffffff788)
                                      )),in_stack_fffffffffffff780,
             (char (*) [63])
             CONCAT17(in_stack_fffffffffffff77f,
                      CONCAT16(in_stack_fffffffffffff77e,
                               CONCAT15(in_stack_fffffffffffff77d,in_stack_fffffffffffff778))),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff770);
  std::__cxx11::string::~string((string *)&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1cc6dc);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13f,message);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message((Message *)0x1cc739);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cc791);
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_fffffffffffff78e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff78e) {
      cfd::core::SchnorrPubkey::GetByteData256(&local_558,&local_1d0);
      cfd::AddressFactory::CreateTaprootAddress
                (in_stack_fffffffffffff7b8,(ByteData256 *)in_stack_fffffffffffff7b0.ptr_);
      cfd::core::Address::operator=(&local_1a8,&local_540);
      cfd::core::Address::~Address(in_stack_fffffffffffff770);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1cc828);
    }
  }
  else {
    testing::Message::Message(&local_560);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x141,
               "Expected: addr = factory.CreateTaprootAddress(pubkey.GetByteData256()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message((Message *)0x1cc92a);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_598,&local_1a8);
  testing::internal::EqHelper<false>::Compare<char[63],std::__cxx11::string>
            ((char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff78e,
                                             CONCAT15(in_stack_fffffffffffff78d,
                                                      in_stack_fffffffffffff788))),
             in_stack_fffffffffffff780,
             (char (*) [63])
             CONCAT17(in_stack_fffffffffffff77f,
                      CONCAT16(in_stack_fffffffffffff77e,
                               CONCAT15(in_stack_fffffffffffff77d,in_stack_fffffffffffff778))),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff770);
  std::__cxx11::string::~string((string *)&local_598);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_578);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_5a0);
    in_stack_fffffffffffff780 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1cca42);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x142,in_stack_fffffffffffff780);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message((Message *)0x1cca9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ccaf7);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x1ccb04);
  cfd::core::ScriptBuilder::AppendOperator
            (&local_5c8,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build(&local_690,&local_5c8);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_658,&local_690);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff770);
  uVar4 = testing::internal::AlwaysTrue();
  if ((bool)uVar4) {
    in_stack_fffffffffffff77e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff77e) {
      cfd::AddressFactory::CreateTaprootAddress
                (in_stack_fffffffffffff7b8,(TaprootScriptTree *)in_stack_fffffffffffff7b0.ptr_,
                 (SchnorrPubkey *)in_stack_fffffffffffff7a8.data_);
      cfd::core::Address::operator=(&local_1a8,&local_808);
      cfd::core::Address::~Address(in_stack_fffffffffffff770);
    }
  }
  else {
    testing::Message::Message(&local_810);
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x147,
               "Expected: addr = factory.CreateTaprootAddress(tree, pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_818,&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    testing::Message::~Message((Message *)0x1ccd09);
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&stack0xfffffffffffff7b8,&local_1a8);
  testing::internal::EqHelper<false>::Compare<char[63],std::__cxx11::string>
            ((char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff78e,
                                             CONCAT15(uVar3,in_stack_fffffffffffff788))),
             in_stack_fffffffffffff780,
             (char (*) [63])
             CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffff77e,
                                     CONCAT15(in_stack_fffffffffffff77d,in_stack_fffffffffffff778)))
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_fffffffffffff770);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff7b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_828);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffff7b0);
    in_stack_fffffffffffff770 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x1cce09);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x148,(char *)in_stack_fffffffffffff770);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff7a8,(Message *)&stack0xfffffffffffff7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff7a8);
    testing::Message::~Message((Message *)0x1cce57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ccea3);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)in_stack_fffffffffffff770);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x1ccebd);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x1cceca);
  cfd::core::Address::~Address(in_stack_fffffffffffff770);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1ccee4);
  return;
}

Assistant:

TEST(AddressFactory, CreateTaprootAddress)
{
  AddressFactory factory;
  Address addr;
  const SchnorrPubkey pubkey = SchnorrPubkey(
    "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey.GetByteData256()));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  ScriptBuilder build;
  build.AppendOperator(ScriptOperator::OP_TRUE);
  TaprootScriptTree tree(build.Build());
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(tree, pubkey));
  EXPECT_EQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah", addr.GetAddress());
}